

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_dynlight.cpp
# Opt level: O3

void gl_ParsePulseLight(FScanner *sc)

{
  undefined1 auVar1 [16];
  bool bVar2;
  uchar uVar3;
  int iVar4;
  int iVar5;
  FLightDefaults *defaults;
  int i;
  long lVar6;
  float floatTriple [3];
  float local_44 [3];
  double *local_38;
  
  FScanner::GetString(sc);
  iVar4 = FName::NameManager::FindName(&FName::NameData,sc->String,false);
  FScanner::GetString(sc);
  bVar2 = FScanner::Compare(sc,"{");
  if (bVar2) {
    defaults = (FLightDefaults *)operator_new(0x38);
    (defaults->m_Name).Index = iVar4;
    defaults->m_type = PulseLight;
    defaults->m_subtractive = false;
    defaults->m_additive = false;
    defaults->m_halo = false;
    defaults->m_dontlightself = false;
    defaults->m_Args[0] = '\0';
    defaults->m_Args[1] = '\0';
    defaults->m_Args[2] = '\0';
    defaults->m_Args[3] = '\0';
    defaults->m_Args[4] = '\0';
    defaults->m_Param = 0.0;
    (defaults->m_Pos).X = 0.0;
    (defaults->m_Pos).Y = 0.0;
    (defaults->m_Pos).Z = 0.0;
    ScriptDepth = ScriptDepth + 1;
    if (ScriptDepth != 0) {
      local_38 = &defaults->m_Param;
      do {
        FScanner::GetString(sc);
        iVar4 = FScanner::MatchString(sc,LightTags,8);
        switch(iVar4) {
        case 0:
          lVar6 = 0;
          do {
            FScanner::GetFloat(sc);
            local_44[lVar6] = (float)sc->Float;
            lVar6 = lVar6 + 1;
          } while (lVar6 != 3);
          iVar4 = (int)(local_44[0] * 255.0);
          if (0xfe < iVar4) {
            iVar4 = 0xff;
          }
          uVar3 = (uchar)iVar4;
          if (iVar4 < 1) {
            uVar3 = '\0';
          }
          iVar4 = (int)(local_44[1] * 255.0);
          if (0xfe < (int)(local_44[1] * 255.0)) {
            iVar4 = 0xff;
          }
          defaults->m_Args[0] = uVar3;
          if (iVar4 < 1) {
            iVar4 = 0;
          }
          iVar5 = (int)(local_44[2] * 255.0);
          defaults->m_Args[1] = (uchar)iVar4;
          if (0xfe < iVar5) {
            iVar5 = 0xff;
          }
          uVar3 = (uchar)iVar5;
          if (iVar5 < 1) {
            uVar3 = '\0';
          }
          defaults->m_Args[2] = uVar3;
          break;
        case 1:
          FScanner::GetNumber(sc);
          iVar4 = sc->Number;
          if (0xfe < iVar4) {
            iVar4 = 0xff;
          }
          uVar3 = (uchar)iVar4;
          if (iVar4 < 1) {
            uVar3 = '\0';
          }
          defaults->m_Args[3] = uVar3;
          break;
        case 2:
          FScanner::GetNumber(sc);
          iVar4 = sc->Number;
          if (0xfe < iVar4) {
            iVar4 = 0xff;
          }
          uVar3 = (uchar)iVar4;
          if (iVar4 < 1) {
            uVar3 = '\0';
          }
          defaults->m_Args[4] = uVar3;
          break;
        case 3:
          lVar6 = 0;
          do {
            FScanner::GetFloat(sc);
            local_44[lVar6] = (float)sc->Float;
            lVar6 = lVar6 + 1;
          } while (lVar6 != 3);
          (defaults->m_Pos).Z = (double)local_44[1];
          auVar1._8_4_ = SUB84((double)local_44[2],0);
          auVar1._0_8_ = (double)local_44[0];
          auVar1._12_4_ = (int)((ulong)(double)local_44[2] >> 0x20);
          (defaults->m_Pos).X = (double)local_44[0];
          (defaults->m_Pos).Y = (double)auVar1._8_8_;
          break;
        default:
          FScanner::ScriptError(sc,"Unknown tag: %s\n",sc->String);
          break;
        case 5:
          FScanner::GetFloat(sc);
          *local_38 = (double)((float)sc->Float * 35.0);
          break;
        case 9:
          ScriptDepth = ScriptDepth + 1;
          break;
        case 10:
          ScriptDepth = ScriptDepth + -1;
          break;
        case 0xb:
          FScanner::GetNumber(sc);
          defaults->m_subtractive = sc->Number != 0;
          break;
        case 0xd:
          FScanner::GetNumber(sc);
          defaults->m_halo = sc->Number != 0;
          break;
        case 0xe:
          FScanner::GetNumber(sc);
          defaults->m_dontlightself = sc->Number != 0;
        }
      } while (ScriptDepth != 0);
    }
    gl_AddLightDefaults(defaults);
    return;
  }
  FScanner::ScriptError(sc,"Expected \'{\'.\n");
  return;
}

Assistant:

void gl_ParsePulseLight(FScanner &sc)
{
	int type;
	float floatVal, floatTriple[3];
	int intVal;
	FLightDefaults *defaults;

	// get name
	sc.GetString();
	FName name = sc.String;

	// check for opening brace
	sc.GetString();
	if (sc.Compare("{"))
	{
		defaults = new FLightDefaults(name, PulseLight);
		ScriptDepth++;
		while (ScriptDepth)
		{
			sc.GetString();
			type = sc.MatchString(LightTags);
			switch (type)
			{
			case LIGHTTAG_OPENBRACE:
				ScriptDepth++;
				break;
			case LIGHTTAG_CLOSEBRACE:
				ScriptDepth--;
				break;
			case LIGHTTAG_COLOR:
				gl_ParseTriple(sc, floatTriple);
				defaults->SetArg(LIGHT_RED, clamp<int>((int)(floatTriple[0] * 255), 0, 255));
				defaults->SetArg(LIGHT_GREEN, clamp<int>((int)(floatTriple[1] * 255), 0, 255));
				defaults->SetArg(LIGHT_BLUE, clamp<int>((int)(floatTriple[2] * 255), 0, 255));
				break;
			case LIGHTTAG_OFFSET:
				gl_ParseTriple(sc, floatTriple);
				defaults->SetOffset(floatTriple);
				break;
			case LIGHTTAG_SIZE:
				intVal = clamp<int>(gl_ParseInt(sc), 0, 255);
				defaults->SetArg(LIGHT_INTENSITY, intVal);
				break;
			case LIGHTTAG_SECSIZE:
				intVal = clamp<int>(gl_ParseInt(sc), 0, 255);
				defaults->SetArg(LIGHT_SECONDARY_INTENSITY, intVal);
				break;
			case LIGHTTAG_INTERVAL:
				floatVal = gl_ParseFloat(sc);
				defaults->SetParameter(floatVal * TICRATE);
				break;
			case LIGHTTAG_SUBTRACTIVE:
				defaults->SetSubtractive(gl_ParseInt(sc) != 0);
				break;
			case LIGHTTAG_HALO:
				defaults->SetHalo(gl_ParseInt(sc) != 0);
				break;
			case LIGHTTAG_DONTLIGHTSELF:
				defaults->SetDontLightSelf(gl_ParseInt(sc) != 0);
				break;
			default:
				sc.ScriptError("Unknown tag: %s\n", sc.String);
			}
		}
		gl_AddLightDefaults(defaults);
	}
	else
	{
		sc.ScriptError("Expected '{'.\n");
	}
}